

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseAnyValue
          (Parser *this,Value *val,FieldDef *field,size_t parent_fieldn,StructDef *parent_struct_def
          ,size_t count,bool inside_vector)

{
  string *this_00;
  uint16_t *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int *piVar3;
  char cVar4;
  EnumDef *pEVar5;
  size_type sVar6;
  ulong uVar7;
  int iVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  long *plVar11;
  bool use_string_pooling;
  CheckedError *ce;
  bool bVar12;
  undefined8 *puVar13;
  Parser *this_01;
  _Alloc_hider _Var14;
  int iVar15;
  size_t parent_fieldn_00;
  long lVar16;
  undefined7 in_stack_00000009;
  char in_stack_00000010;
  uint *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_name;
  uoffset_t offset;
  StructDef *pSStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  bool local_118;
  _Alloc_hider local_110;
  char local_100 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  string next_name;
  string constant;
  uoffset_t off;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  use_string_pooling = SUB81(field,0);
  switch(*(undefined4 *)&(field->super_Definition).name._M_dataplus._M_p) {
  case 7:
  case 8:
  case 9:
  case 10:
    if (parent_fieldn == 0) {
LAB_0010f76f:
      bVar12 = false;
    }
    else {
      _offset = (pointer)&local_128;
      local_128._M_allocated_capacity._0_4_ = 0x68736168;
      pSStack_130 = (StructDef *)0x4;
      local_128._M_allocated_capacity._4_4_ = local_128._M_allocated_capacity._4_4_ & 0xffffff00;
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      *)(parent_fieldn + 0x58),(key_type *)&offset);
      if ((cVar9._M_node == (_Base_ptr)(parent_fieldn + 0x60)) ||
         (*(long *)(cVar9._M_node + 2) == 0)) goto LAB_0010f76f;
      iVar15 = *(int *)&(val->type).field_0x1c;
      bVar12 = iVar15 == 0x101 || iVar15 == 0x104;
    }
    if ((parent_fieldn != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_offset != &local_128)) {
      operator_delete(_offset,CONCAT44(local_128._M_allocated_capacity._4_4_,
                                       local_128._M_allocated_capacity._0_4_) + 1);
    }
    if (!bVar12) goto switchD_0010f70c_caseD_b;
    ParseHash(this,val,field);
    break;
  default:
switchD_0010f70c_caseD_b:
    ParseSingleValue(this,(string *)val,(Value *)parent_fieldn,use_string_pooling);
    break;
  case 0xd:
    ParseString(this,val,use_string_pooling);
    break;
  case 0xe:
  case 0x12:
    ParseVector(this,&val->type,(uoffset_t *)field,(FieldDef *)&off,parent_fieldn);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f87b;
    NumToString<unsigned_int>((string *)&offset,off);
    std::__cxx11::string::operator=((string *)&(field->super_Definition).file,(string *)&offset);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_offset != &local_128) {
      operator_delete(_offset,CONCAT44(local_128._M_allocated_capacity._4_4_,
                                       local_128._M_allocated_capacity._0_4_) + 1);
    }
    goto LAB_0010f876;
  case 0xf:
    ParseTable(this,(StructDef *)val,(string *)(field->super_Definition).name._M_string_length,
               (uoffset_t *)&(field->super_Definition).file);
    break;
  case 0x10:
    if (parent_fieldn == 0) {
      __assert_fail("field",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x520,
                    "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                   );
    }
    constant._M_dataplus._M_p = (pointer)&constant.field_2;
    constant._M_string_length = 0;
    constant.field_2._M_local_buf[0] = '\0';
    puVar13 = (undefined8 *)
              (val[0x19].constant.field_2._M_allocated_capacity +
               CONCAT71(in_stack_00000009,inside_vector) * -0x50 + -0x30);
    local_160 = (uint *)0x0;
    do {
      if (puVar13 + 6 ==
          (undefined8 *)
          (val[0x19].constant.field_2._M_allocated_capacity + (long)parent_struct_def * -0x50 +
          CONCAT71(in_stack_00000009,inside_vector) * -0x50)) {
        iVar15 = 3;
        break;
      }
      lVar16 = puVar13[5];
      iVar15 = 0;
      if (*(size_type *)(lVar16 + 0xd8) ==
          (field->super_Definition).name.field_2._M_allocated_capacity) {
        iVar8 = *(int *)(lVar16 + 200);
        if (in_stack_00000010 == '\0') {
          iVar15 = 0;
          if (iVar8 == 1) {
            iVar15 = 3;
            std::__cxx11::string::_M_assign((string *)&constant);
          }
        }
        else if (((iVar8 == 0x12) || (iVar8 == 0xe)) && (iVar15 = 0, *(int *)(lVar16 + 0xcc) == 1))
        {
          anon_unknown_0::atot<unsigned_int>
                    ((anon_unknown_0 *)this,(char *)*puVar13,(Parser *)val,&offset);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          iVar15 = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            pEVar5 = val[7].type.enum_def;
            if (pEVar5 == (EnumDef *)0x0) {
              __assert_fail("cur_",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                            ,0xb3,
                            "uint8_t *flatbuffers::vector_downward<>::data() const [SizeT = unsigned int]"
                           );
            }
            local_160 = (uint *)((long)pEVar5 +
                                ((ulong)val[7].type.base_type - ((ulong)_offset & 0xffffffff)));
            iVar15 = 3;
          }
        }
      }
      puVar13 = puVar13 + -10;
    } while (iVar15 == 0);
    if (iVar15 == 3) {
      if (constant._M_string_length == 0 && in_stack_00000010 == '\0') {
        paVar2 = &type_name.field_2;
        type_name._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&type_name,*(long *)parent_fieldn,
                   *(long *)(parent_fieldn + 8) + *(long *)parent_fieldn);
        std::__cxx11::string::append((char *)&type_name);
        if (count == 0) {
          __assert_fail("parent_struct_def",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                        ,0x542,
                        "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                       );
        }
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                         *)(count + 200),&type_name);
        if (cVar10._M_node == (_Base_ptr)(count + 0xd0)) {
          parent_fieldn_00 = 0;
        }
        else {
          parent_fieldn_00 = *(size_t *)(cVar10._M_node + 2);
        }
        if (parent_fieldn_00 == 0) {
          __assert_fail("type_field",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                        ,0x544,
                        "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                       );
        }
        local_118 = *(bool *)&(val->constant)._M_dataplus._M_p;
        _offset = *(pointer *)&val->type;
        pSStack_130 = (val->type).struct_def;
        local_128._M_allocated_capacity._0_4_ = *(undefined4 *)&(val->type).enum_def;
        local_128._M_allocated_capacity._4_4_ = *(uint *)((long)&(val->type).enum_def + 4);
        local_128._8_4_ = *(undefined4 *)&(val->type).fixed_length;
        local_128._12_4_ = *(undefined4 *)&(val->type).field_0x1c;
        local_110._M_p = local_100;
        sVar6 = (val->constant)._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,sVar6,(val->constant).field_2._M_allocated_capacity + sVar6)
        ;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(val + 1));
        SkipAnyJsonValue(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          iVar15 = (int)val;
          if (val[0x12].constant.field_2._M_local_buf[8] == '\0') {
            Expect(this,iVar15);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0010fbc2;
          }
          else {
LAB_0010fbc2:
            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
          }
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            next_name._M_dataplus._M_p = (pointer)&next_name.field_2;
            sVar6 = (val->constant)._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&next_name,sVar6,
                       (val->constant).field_2._M_allocated_capacity + sVar6);
            if (*(int *)&(val->type).field_0x1c == 0x101) {
              Next(this);
            }
            else {
              Expect(this,iVar15);
            }
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              if ((next_name._M_string_length != type_name._M_string_length) ||
                 ((next_name._M_string_length != 0 &&
                  (iVar8 = bcmp(next_name._M_dataplus._M_p,type_name._M_dataplus._M_p,
                                next_name._M_string_length), iVar8 != 0)))) {
LAB_0010fd56:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)next_name._M_dataplus._M_p != &next_name.field_2) {
                  operator_delete(next_name._M_dataplus._M_p,
                                  next_name.field_2._M_allocated_capacity + 1);
                }
                ParserState::~ParserState((ParserState *)&offset);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)type_name._M_dataplus._M_p != paVar2) {
                  operator_delete(type_name._M_dataplus._M_p,
                                  type_name.field_2._M_allocated_capacity + 1);
                }
                goto LAB_0010fa46;
              }
              Expect(this,iVar15);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                iVar15 = *(int *)((long)&val[0x1a].constant._M_string_length + 4);
                if (0x40 < iVar15) {
                  __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                                ,0x19d,
                                "flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
                }
                *(int *)((long)&val[0x1a].constant._M_string_length + 4) = iVar15 + 1;
                if (iVar15 == 0x40) {
                  RecurseError(this);
                }
                else {
                  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                }
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  off = *(uoffset_t *)(parent_fieldn_00 + 200);
                  uStack_74 = *(undefined4 *)(parent_fieldn_00 + 0xcc);
                  uStack_70 = *(undefined4 *)(parent_fieldn_00 + 0xd0);
                  uStack_6c = *(undefined4 *)(parent_fieldn_00 + 0xd4);
                  local_68._M_allocated_capacity._0_4_ = *(undefined4 *)(parent_fieldn_00 + 0xd8);
                  local_68._M_allocated_capacity._4_4_ = *(undefined4 *)(parent_fieldn_00 + 0xdc);
                  local_68._8_4_ = *(undefined4 *)(parent_fieldn_00 + 0xe0);
                  local_68._12_4_ = *(undefined4 *)(parent_fieldn_00 + 0xe4);
                  local_58._M_p = (pointer)&local_48;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_58,*(long *)(parent_fieldn_00 + 0xe8),
                             *(long *)(parent_fieldn_00 + 0xf0) + *(long *)(parent_fieldn_00 + 0xe8)
                            );
                  local_38 = *(undefined2 *)(parent_fieldn_00 + 0x108);
                  ParseAnyValue(this,val,(FieldDef *)&off,parent_fieldn_00,(StructDef *)0x0,0,false)
                  ;
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  cVar4 = *(char *)&(this->super_ParserState).prev_cursor_;
                  if (cVar4 == '\0') {
                    std::__cxx11::string::_M_assign((string *)&constant);
                    ParserState::operator=((ParserState *)val,(ParserState *)&offset);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_p != &local_48) {
                    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
                  }
                  piVar3 = (int *)((long)&val[0x1a].constant._M_string_length + 4);
                  *piVar3 = *piVar3 + -1;
                  if (cVar4 == '\0') goto LAB_0010fd56;
                }
                else {
                  piVar3 = (int *)((long)&val[0x1a].constant._M_string_length + 4);
                  *piVar3 = *piVar3 + -1;
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)next_name._M_dataplus._M_p != &next_name.field_2) {
              operator_delete(next_name._M_dataplus._M_p,next_name.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        ParserState::~ParserState((ParserState *)&offset);
        _Var14 = type_name._M_dataplus;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p != paVar2) goto LAB_0010fec1;
      }
      else {
LAB_0010fa46:
        if ((constant._M_string_length == 0) && (local_160 == (uint *)0x0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &offset,"missing type field for this union value: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         parent_fieldn);
          Error(this,(string *)val);
        }
        else {
          if (local_160 == (uint *)0x0) {
            anon_unknown_0::atot<unsigned_char>
                      ((anon_unknown_0 *)this,constant._M_dataplus._M_p,(Parser *)val,(uchar *)&off)
            ;
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            iVar15 = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010fecf;
          }
          else {
            uVar7 = CONCAT71(in_stack_00000009,inside_vector);
            if (*local_160 <= uVar7) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &offset,"union types vector smaller than union values vector for: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             parent_fieldn);
              Error(this,(string *)val);
              goto LAB_0010feae;
            }
            if (*local_160 <= (uint)uVar7) {
              __assert_fail("i < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                            ,0xc1,
                            "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                           );
            }
            off = CONCAT31(off._1_3_,*(undefined1 *)((long)local_160 + (uVar7 & 0xffffffff) + 4));
          }
          sVar6 = (field->super_Definition).name.field_2._M_allocated_capacity;
          plVar11 = (long *)((ulong)*(byte *)(sVar6 + 200) * 8 + *(long *)(sVar6 + 0x120));
          if (plVar11 == *(long **)(sVar6 + 0x128)) {
            lVar16 = 0;
          }
          else {
            do {
              lVar16 = *plVar11;
              if (*(ulong *)(lVar16 + 0xa0) == (ulong)(byte)off) goto LAB_0010fdad;
              plVar11 = plVar11 + 1;
            } while (plVar11 != *(long **)(sVar6 + 0x128));
            lVar16 = 0;
          }
LAB_0010fdad:
          if (lVar16 != 0) {
            if (*(int *)(lVar16 + 0x38) == 0xd) {
              ParseString(this,val,use_string_pooling);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              iVar15 = 2 - (uint)*(byte *)&(this->super_ParserState).prev_cursor_;
            }
            else {
              if (*(int *)(lVar16 + 0x38) != 0xf) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                              ,0x575,
                              "CheckedError flatbuffers::Parser::ParseAnyValue(Value &, FieldDef *, size_t, const StructDef *, size_t, bool)"
                             );
              }
              this_00 = &(field->super_Definition).file;
              this_01 = this;
              ParseTable(this,(StructDef *)val,*(string **)(lVar16 + 0x40),(uoffset_t *)this_00);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              iVar15 = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                iVar15 = 2;
                if ((*(StructDef **)(lVar16 + 0x40))->fixed == true) {
                  SerializeStruct(this_01,(FlatBufferBuilder *)&val[6].type.fixed_length,
                                  *(StructDef **)(lVar16 + 0x40),(Value *)field);
                  puVar1 = &val[7].type.fixed_length;
                  *(ulong *)puVar1 =
                       *(long *)puVar1 + (ulong)*(uint *)&val[7].constant._M_dataplus._M_p * -8;
                  *(undefined4 *)&val[7].constant._M_dataplus._M_p = 0;
                  *(undefined2 *)((long)&val[7].constant._M_dataplus._M_p + 4) = 0;
                  NumToString<unsigned_int>((string *)&offset,val[7].type.base_type);
                  std::__cxx11::string::operator=((string *)this_00,(string *)&offset);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_offset != &local_128) {
                    operator_delete(_offset,CONCAT44(local_128._M_allocated_capacity._4_4_,
                                                     local_128._M_allocated_capacity._0_4_) + 1);
                  }
                }
              }
            }
            goto LAB_0010fecf;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &offset,"illegal type id for: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         parent_fieldn);
          Error(this,(string *)val);
        }
LAB_0010feae:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_offset != &local_128) {
          type_name.field_2._M_allocated_capacity =
               CONCAT44(local_128._M_allocated_capacity._4_4_,local_128._M_allocated_capacity._0_4_)
          ;
          _Var14._M_p = _offset;
LAB_0010fec1:
          operator_delete(_Var14._M_p,type_name.field_2._M_allocated_capacity + 1);
        }
      }
      iVar15 = 1;
    }
LAB_0010fecf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)constant._M_dataplus._M_p != &constant.field_2) {
      operator_delete(constant._M_dataplus._M_p,
                      CONCAT71(constant.field_2._M_allocated_capacity._1_7_,
                               constant.field_2._M_local_buf[0]) + 1);
    }
    if (iVar15 == 1) goto LAB_0010f87b;
    goto LAB_0010f876;
  case 0x11:
    ParseArray(this,val);
  }
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
LAB_0010f876:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0010f87b:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseAnyValue(Value &val, FieldDef *field,
                                   size_t parent_fieldn,
                                   const StructDef *parent_struct_def,
                                   size_t count, bool inside_vector) {
  switch (val.type.base_type) {
    case BASE_TYPE_UNION: {
      FLATBUFFERS_ASSERT(field);
      std::string constant;
      Vector<uint8_t> *vector_of_union_types = nullptr;
      // Find corresponding type field we may have already parsed.
      for (auto elem = field_stack_.rbegin() + count;
           elem != field_stack_.rbegin() + parent_fieldn + count; ++elem) {
        auto &type = elem->second->value.type;
        if (type.enum_def == val.type.enum_def) {
          if (inside_vector) {
            if (IsVector(type) && type.element == BASE_TYPE_UTYPE) {
              // Vector of union type field.
              uoffset_t offset;
              ECHECK(atot(elem->first.constant.c_str(), *this, &offset));
              vector_of_union_types = reinterpret_cast<Vector<uint8_t> *>(
                  builder_.GetCurrentBufferPointer() + builder_.GetSize() -
                  offset);
              break;
            }
          } else {
            if (type.base_type == BASE_TYPE_UTYPE) {
              // Union type field.
              constant = elem->first.constant;
              break;
            }
          }
        }
      }
      if (constant.empty() && !inside_vector) {
        // We haven't seen the type field yet. Sadly a lot of JSON writers
        // output these in alphabetical order, meaning it comes after this
        // value. So we scan past the value to find it, then come back here.
        // We currently don't do this for vectors of unions because the
        // scanning/serialization logic would get very complicated.
        auto type_name = field->name + UnionTypeFieldSuffix();
        FLATBUFFERS_ASSERT(parent_struct_def);
        auto type_field = parent_struct_def->fields.Lookup(type_name);
        FLATBUFFERS_ASSERT(type_field);  // Guaranteed by ParseField().
        // Remember where we are in the source file, so we can come back here.
        auto backup = *static_cast<ParserState *>(this);
        ECHECK(SkipAnyJsonValue());  // The table.
        ECHECK(ParseComma());
        auto next_name = attribute_;
        if (Is(kTokenStringConstant)) {
          NEXT();
        } else {
          EXPECT(kTokenIdentifier);
        }
        if (next_name == type_name) {
          EXPECT(':');
          ParseDepthGuard depth_guard(this);
          ECHECK(depth_guard.Check());
          Value type_val = type_field->value;
          ECHECK(ParseAnyValue(type_val, type_field, 0, nullptr, 0));
          constant = type_val.constant;
          // Got the information we needed, now rewind:
          *static_cast<ParserState *>(this) = backup;
        }
      }
      if (constant.empty() && !vector_of_union_types) {
        return Error("missing type field for this union value: " + field->name);
      }
      uint8_t enum_idx;
      if (vector_of_union_types) {
        if (vector_of_union_types->size() <= count)
          return Error(
              "union types vector smaller than union values vector for: " +
              field->name);
        enum_idx = vector_of_union_types->Get(static_cast<uoffset_t>(count));
      } else {
        ECHECK(atot(constant.c_str(), *this, &enum_idx));
      }
      auto enum_val = val.type.enum_def->ReverseLookup(enum_idx, true);
      if (!enum_val) return Error("illegal type id for: " + field->name);
      if (enum_val->union_type.base_type == BASE_TYPE_STRUCT) {
        ECHECK(ParseTable(*enum_val->union_type.struct_def, &val.constant,
                          nullptr));
        if (enum_val->union_type.struct_def->fixed) {
          // All BASE_TYPE_UNION values are offsets, so turn this into one.
          SerializeStruct(*enum_val->union_type.struct_def, val);
          builder_.ClearOffsets();
          val.constant = NumToString(builder_.GetSize());
        }
      } else if (IsString(enum_val->union_type)) {
        ECHECK(ParseString(val, field->shared));
      } else {
        FLATBUFFERS_ASSERT(false);
      }
      break;
    }
    case BASE_TYPE_STRUCT:
      ECHECK(ParseTable(*val.type.struct_def, &val.constant, nullptr));
      break;
    case BASE_TYPE_STRING: {
      ECHECK(ParseString(val, field->shared));
      break;
    }
    case BASE_TYPE_VECTOR64:
    case BASE_TYPE_VECTOR: {
      uoffset_t off;
      ECHECK(ParseVector(val.type, &off, field, parent_fieldn));
      val.constant = NumToString(off);
      break;
    }
    case BASE_TYPE_ARRAY: {
      ECHECK(ParseArray(val));
      break;
    }
    case BASE_TYPE_INT:
    case BASE_TYPE_UINT:
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG: {
      if (field && field->attributes.Lookup("hash") &&
          (token_ == kTokenIdentifier || token_ == kTokenStringConstant)) {
        ECHECK(ParseHash(val, field));
      } else {
        ECHECK(ParseSingleValue(field ? &field->name : nullptr, val, false));
      }
      break;
    }
    default:
      ECHECK(ParseSingleValue(field ? &field->name : nullptr, val, false));
      break;
  }
  return NoError();
}